

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focus.cpp
# Opt level: O3

vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *
anon_unknown.dwarf_2307a::gen_focus_front_widg_tree(void)

{
  pointer ppWVar1;
  Widget **ppWVar2;
  __normal_iterator<cppurses::Widget_**,_std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>_>
  _Var3;
  vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *in_RDI;
  Widget *focus_widg;
  value_type local_20;
  
  cppurses::Children_data::get_descendants(in_RDI,&cppurses::System::head_->children);
  local_20 = cppurses::System::head_;
  std::vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>::_M_insert_rval
            (in_RDI,(const_iterator)
                    (in_RDI->
                    super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>).
                    _M_impl.super__Vector_impl_data._M_start,&local_20);
  local_20 = cppurses::Focus::focus_widget_;
  _Var3._M_current = (Widget **)cppurses::Focus::focus_widget_;
  if (cppurses::Focus::focus_widget_ != (value_type)0x0) {
    ppWVar1 = (in_RDI->super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppWVar2 = (in_RDI->super__Vector_base<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<cppurses::Widget**,std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>,__gnu_cxx::__ops::_Iter_equals_val<cppurses::Widget*const>>
                      (ppWVar1,ppWVar2,&local_20);
    if (_Var3._M_current != ppWVar2) {
      _Var3 = std::_V2::
              __rotate<__gnu_cxx::__normal_iterator<cppurses::Widget**,std::vector<cppurses::Widget*,std::allocator<cppurses::Widget*>>>>
                        (ppWVar1,_Var3._M_current,ppWVar2);
    }
  }
  return (vector<cppurses::Widget_*,_std::allocator<cppurses::Widget_*>_> *)_Var3._M_current;
}

Assistant:

auto gen_focus_front_widg_tree()
{
    auto widg_tree = System::head()->children.get_descendants();
    widg_tree.insert(std::begin(widg_tree), System::head());
    auto* const focus_widg = Focus::focus_widget();
    if (focus_widg != nullptr) {
        const auto begin = std::begin(widg_tree);
        const auto end   = std::end(widg_tree);
        const auto iter  = std::find(begin, end, focus_widg);
        if (iter != end)
            std::rotate(begin, iter, end);
    }
    return widg_tree;
}